

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O2

void __thiscall
S2CellId::AppendAllNeighbors
          (S2CellId *this,int nbr_level,vector<S2CellId,_std::allocator<S2CellId>_> *output)

{
  bool bVar1;
  int iVar2;
  vector<S2CellId,_std::allocator<S2CellId>_> *pvVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  S2CellId local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  S2LogMessage local_88;
  ulong local_78;
  int local_6c;
  uint local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  undefined8 local_50;
  vector<S2CellId,_std::allocator<S2CellId>_> *local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = output;
  iVar4 = level(this);
  if (nbr_level < iVar4) {
    S2LogMessage::S2LogMessage
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.cc"
               ,0x223,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_88.stream_,"Check failed: (nbr_level) >= (level()) ");
  }
  else {
    local_90 = ToFaceIJOrientation(this,(int *)&local_5c,(int *)&local_60,(int *)0x0);
    local_8c = GetSizeIJ(this);
    local_50 = CONCAT44(extraout_var,local_8c);
    uVar7 = 1 << (0x1eU - (char)nbr_level & 0x1f);
    local_38 = (ulong)uVar7;
    if ((int)uVar7 <= local_8c) {
      local_5c = local_5c & -local_8c;
      local_58 = (ulong)local_5c;
      local_60 = -local_8c & local_60;
      local_78 = (ulong)local_60;
      uVar10 = -uVar7;
      local_68 = ~local_60;
      local_6c = local_60 - uVar7;
      local_98 = local_60 + local_8c;
      local_64 = local_5c - uVar7;
      local_8c = local_5c + local_8c;
      iVar4 = uVar7 * -2;
      local_94 = nbr_level;
      do {
        iVar2 = local_90;
        local_40 = (ulong)uVar10;
        iVar5 = (int)local_50;
        iVar8 = (int)local_78;
        if ((int)uVar10 < 0) {
          bVar6 = (int)local_68 < (int)uVar10;
        }
        else {
          bVar6 = (int)uVar10 < iVar5;
          iVar9 = iVar8;
          uVar7 = uVar10;
          if (bVar6) {
            bVar1 = local_98 < 0x40000000;
            iVar9 = (int)local_58 + uVar10;
            local_a0 = FromFaceIJSame(local_90,iVar9,local_6c,iVar5 <= iVar8);
            iVar5 = local_94;
            local_88._0_8_ = parent(&local_a0,local_94);
            pvVar3 = local_48;
            std::vector<S2CellId,_std::allocator<S2CellId>_>::emplace_back<S2CellId>
                      (local_48,(S2CellId *)&local_88);
            local_a0 = FromFaceIJSame(iVar2,iVar9,local_98,bVar1);
            local_88._0_8_ = parent(&local_a0,iVar5);
            std::vector<S2CellId,_std::allocator<S2CellId>_>::emplace_back<S2CellId>
                      (pvVar3,(S2CellId *)&local_88);
            iVar5 = (int)local_50;
            iVar9 = (int)local_78;
            uVar7 = (uint)local_40;
          }
          bVar6 = bVar6 || (int)(iVar8 + uVar10) < 0x40000000;
          iVar8 = iVar9;
          uVar10 = uVar7;
        }
        iVar2 = local_90;
        bVar1 = local_8c < 0x40000000;
        local_a0 = FromFaceIJSame(local_90,local_64,iVar8 + uVar10,
                                  (bool)(iVar5 <= (int)local_58 & bVar6));
        iVar5 = local_94;
        local_88._0_8_ = parent(&local_a0,local_94);
        pvVar3 = local_48;
        std::vector<S2CellId,_std::allocator<S2CellId>_>::emplace_back<S2CellId>
                  (local_48,(S2CellId *)&local_88);
        local_a0 = FromFaceIJSame(iVar2,local_8c,iVar8 + uVar10,(bool)(bVar1 & bVar6));
        local_88._0_8_ = parent(&local_a0,iVar5);
        std::vector<S2CellId,_std::allocator<S2CellId>_>::emplace_back<S2CellId>
                  (pvVar3,(S2CellId *)&local_88);
        uVar10 = (int)local_40 + (int)local_38;
        iVar4 = iVar4 + (int)local_38;
      } while (iVar4 < (int)local_50);
      return;
    }
    S2LogMessage::S2LogMessage
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.cc"
               ,0x22f,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_88.stream_,"Check failed: (nbr_size) <= (size) ");
  }
  abort();
}

Assistant:

void S2CellId::AppendAllNeighbors(int nbr_level,
                                  vector<S2CellId>* output) const {
  S2_DCHECK_GE(nbr_level, level());
  int i, j;
  int face = ToFaceIJOrientation(&i, &j, nullptr);

  // Find the coordinates of the lower left-hand leaf cell.  We need to
  // normalize (i,j) to a known position within the cell because nbr_level
  // may be larger than this cell's level.
  int size = GetSizeIJ();
  i &= -size;
  j &= -size;

  int nbr_size = GetSizeIJ(nbr_level);
  S2_DCHECK_LE(nbr_size, size);

  // We compute the top-bottom, left-right, and diagonal neighbors in one
  // pass.  The loop test is at the end of the loop to avoid 32-bit overflow.
  for (int k = -nbr_size; ; k += nbr_size) {
    bool same_face;
    if (k < 0) {
      same_face = (j + k >= 0);
    } else if (k >= size) {
      same_face = (j + k < kMaxSize);
    } else {
      same_face = true;
      // Top and bottom neighbors.
      output->push_back(FromFaceIJSame(face, i + k, j - nbr_size,
                                       j - size >= 0).parent(nbr_level));
      output->push_back(FromFaceIJSame(face, i + k, j + size,
                                       j + size < kMaxSize).parent(nbr_level));
    }
    // Left, right, and diagonal neighbors.
    output->push_back(FromFaceIJSame(face, i - nbr_size, j + k,
                                     same_face && i - size >= 0)
                      .parent(nbr_level));
    output->push_back(FromFaceIJSame(face, i + size, j + k,
                                     same_face && i + size < kMaxSize)
                      .parent(nbr_level));
    if (k >= size) break;
  }
}